

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O2

void __thiscall Js::FunctionBody::RecordIntConstant(FunctionBody *this,RegSlot location,uint val)

{
  Var var;
  
  if ((((((this->super_ParseableFunctionInfo).super_FunctionProxy.m_scriptContext)->config).
       threadConfig)->m_Force32BitByteCode == true) && (0x7ffffffe < val + 0x3fffffff)) {
    var = JavascriptNumber::ToVar((double)(int)val);
  }
  else {
    var = (Var)((ulong)val | 0x1000000000000);
  }
  RecordConstant(this,location,var);
  return;
}

Assistant:

void FunctionBody::RecordIntConstant(RegSlot location, unsigned int val)
    {
        ScriptContext *scriptContext = this->GetScriptContext();
#ifdef ENABLE_TEST_HOOKS
        Var intConst = scriptContext->GetConfig()->Force32BitByteCode() ?
            JavascriptNumber::ToVarFor32BitBytecode((int32)val, scriptContext) :
            JavascriptNumber::ToVar((int32)val, scriptContext);
#else
        Var intConst = JavascriptNumber::ToVar((int32)val, scriptContext);
#endif
        this->RecordConstant(location, intConst);
    }